

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O2

void __thiscall OpenMD::IcosahedralOfR::writeOrderParameter(IcosahedralOfR *this)

{
  string *__lhs;
  char cVar1;
  ostream *poVar2;
  uint i;
  ulong uVar3;
  uint i_1;
  Revision rev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  ofstream osw;
  ofstream osq;
  
  __lhs = &(this->super_BOPofR).super_StaticAnalyser.outputFilename_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&osw,__lhs,
                 "qr");
  std::ofstream::ofstream(&osq,_osw,_S_out);
  std::__cxx11::string::~string((string *)&osw);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&osw,__lhs,
                   "q");
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",_osw);
    std::__cxx11::string::~string((string *)&osw);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&osq,"# ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(this->super_BOPofR).super_StaticAnalyser.analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&osq,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((string *)&osw,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&osw);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&osw);
    poVar2 = std::operator<<((ostream *)&osq,"# ");
    Revision::getBuildDate_abi_cxx11_((string *)&osw,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&osw);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&osw);
    poVar2 = std::operator<<((ostream *)&osq,"# selection script: \"");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_BOPofR).selectionScript_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&osq,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &(this->super_BOPofR).super_StaticAnalyser.paramString_);
      std::operator<<(poVar2,"\n");
    }
    for (uVar3 = 0; uVar3 < (this->super_BOPofR).super_StaticAnalyser.nBins_; uVar3 = uVar3 + 1) {
      std::ostream::_M_insert<double>
                (((double)(uVar3 & 0xffffffff) + 0.5) * (this->super_BOPofR).deltaR_);
      if ((this->super_BOPofR).RCount_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] == 0) {
        poVar2 = std::operator<<((ostream *)&osq,"\t");
        std::ostream::operator<<((ostream *)poVar2,0);
      }
      else {
        std::operator<<((ostream *)&osq,"\t");
        std::ostream::_M_insert<double>
                  ((double)(this->super_BOPofR).QofR_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar3] /
                   (double)(this->super_BOPofR).RCount_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3]);
      }
      std::operator<<((ostream *)&osq,"\n");
    }
    std::ofstream::close();
  }
  std::operator+(&local_450,__lhs,"wr");
  std::ofstream::ofstream(&osw,local_450._M_dataplus._M_p,_S_out);
  std::__cxx11::string::~string((string *)&local_450);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_450,__lhs,"w");
    snprintf(painCave.errMsg,2000,"IcosahedralOfR: unable to open %s\n",local_450._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_450);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&osw,"# ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &(this->super_BOPofR).super_StaticAnalyser.analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&osw,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_450,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_450);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_450);
    poVar2 = std::operator<<((ostream *)&osw,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_450,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_450);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_450);
    poVar2 = std::operator<<((ostream *)&osw,"# selection script: \"");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_BOPofR).selectionScript_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_BOPofR).super_StaticAnalyser.paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&osw,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)
                                      &(this->super_BOPofR).super_StaticAnalyser.paramString_);
      std::operator<<(poVar2,"\n");
    }
    for (uVar3 = 0; uVar3 < (this->super_BOPofR).super_StaticAnalyser.nBins_; uVar3 = uVar3 + 1) {
      std::ostream::_M_insert<double>
                (((double)(uVar3 & 0xffffffff) + 0.5) * (this->super_BOPofR).deltaR_);
      if ((this->super_BOPofR).RCount_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] == 0) {
        poVar2 = std::operator<<((ostream *)&osw,"\t");
        std::ostream::operator<<((ostream *)poVar2,0);
      }
      else {
        std::operator<<((ostream *)&osw,"\t");
        std::ostream::_M_insert<double>
                  ((double)(this->super_BOPofR).WofR_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar3] /
                   (double)(this->super_BOPofR).RCount_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3]);
      }
      std::operator<<((ostream *)&osw,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&osw);
  std::ofstream::~ofstream(&osq);
  return;
}

Assistant:

void IcosahedralOfR::writeOrderParameter() {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "qr").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:

      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = (i + 0.5) * deltaR_;
        osq << Rval;
        if (RCount_[i] == 0) {
          osq << "\t" << 0;
          osq << "\n";
        } else {
          osq << "\t" << (RealType)QofR_[i] / (RealType)RCount_[i];
          osq << "\n";
        }
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "wr").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      // Normalize by number of frames and write it out:
      for (unsigned int i = 0; i < nBins_; ++i) {
        RealType Rval = deltaR_ * (i + 0.5);
        osw << Rval;
        if (RCount_[i] == 0) {
          osw << "\t" << 0;
          osw << "\n";
        } else {
          osw << "\t" << (RealType)WofR_[i] / (RealType)RCount_[i];
          osw << "\n";
        }
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "IcosahedralOfR: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }